

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Maybe<kj::Promise<unsigned_long>_> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedRead::tryPumpFrom
          (BlockedRead *this,AsyncInputStream *input,uint64_t amount)

{
  AsyncInputStream *adapterConstructorParams;
  _func_int **pp_Var1;
  PromiseArena *pPVar2;
  SourceLocation location;
  OwnPromiseNode OVar3;
  void *pvVar4;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX;
  TransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:1100:17),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:465:12)>
  *location_00;
  bool bVar5;
  bool bVar6;
  Maybe<kj::Promise<unsigned_long>_> MVar7;
  DebugExpression<bool> _kjCondition;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  Fault f;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_b8;
  OwnPromiseNode local_b0;
  anon_class_24_3_e7c12ea1_for_func local_a8;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_90;
  code *local_88;
  DebugComparison<unsigned_long_&,_unsigned_long_&> local_80;
  anon_class_16_2_d8ee3cd1_for_errorHandler local_58;
  AsyncOutputStream local_48;
  OwnPromiseNode local_40;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_38;
  
  bVar5 = input[0xc]._vptr_AsyncInputStream == (_func_int **)0x0;
  local_a8.this = (BlockedRead *)CONCAT71(local_a8.this._1_7_,bVar5);
  if (!bVar5) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
              ((Fault *)&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0x445,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",
               (DebugExpression<bool> *)&local_a8,(char (*) [16])"already pumping");
    kj::_::Debug::Fault::fatal((Fault *)&local_80);
  }
  local_80.left = (unsigned_long *)(input + 6);
  local_80.right = (unsigned_long *)(input + 10);
  pp_Var1 = input[6]._vptr_AsyncInputStream;
  bVar5 = input[10]._vptr_AsyncInputStream <= pp_Var1;
  bVar6 = pp_Var1 != input[10]._vptr_AsyncInputStream;
  local_80.op.content.ptr = " > ";
  local_80.op.content.size_ = 4;
  local_80.result = bVar5 && bVar6;
  if (bVar5 && bVar6) {
    adapterConstructorParams = input + 0xc;
    (**(code **)(*(long *)amount + 8))(&local_b8,amount,input[4]._vptr_AsyncInputStream);
    local_58.fulfiller =
         (PromiseFulfiller<kj::AsyncCapabilityStream::ReadResult> *)input[2]._vptr_AsyncInputStream;
    local_80.left = (unsigned_long *)0x44846f;
    local_80.right = (unsigned_long *)0x3f3bd9;
    local_80.op.content.ptr = (char *)0x1c0000044b;
    local_88 = kj::_::
               TransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1100:17),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:465:12)>
               ::anon_class_24_3_e7c12ea1_for_func::operator();
    pPVar2 = ((local_b8.ptr)->super_PromiseArenaMember).arena;
    local_a8.this = (BlockedRead *)input;
    local_a8.input = (AsyncInputStream *)amount;
    local_58.canceler = (Canceler *)adapterConstructorParams;
    if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)local_b8.ptr - (long)pPVar2) < 0x48) {
      pvVar4 = operator_new(0x400);
      location_00 = (TransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:1100:17),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:465:12)>
                     *)((long)pvVar4 + 0x3b8);
      ctor<kj::_::TransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedRead::tryPumpFrom(kj::AsyncInputStream&,unsigned_long)::_lambda(unsigned_long)_1_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionPromise<unsigned_long,kj::PromiseFulfiller<kj::AsyncCapabilityStream::ReadResult>>(kj::PromiseFulfiller<kj::AsyncCapabilityStream::ReadResult>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedRead::tryPumpFrom(kj::AsyncInputStream&,unsigned_long)::_lambda(unsigned_long)_1_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionPromise<unsigned_long,kj::PromiseFulfiller<kj::AsyncCapabilityStream::ReadResult>>(kj::PromiseFulfiller<kj::AsyncCapabilityStream::ReadResult>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_,void*&>
                (location_00,&local_b8,&local_a8,&local_58,&local_88);
      *(void **)((long)pvVar4 + 0x3c0) = pvVar4;
    }
    else {
      ((local_b8.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
      location_00 = (TransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:1100:17),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:465:12)>
                     *)&local_b8.ptr[-5].super_PromiseArenaMember.arena;
      ctor<kj::_::TransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedRead::tryPumpFrom(kj::AsyncInputStream&,unsigned_long)::_lambda(unsigned_long)_1_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionPromise<unsigned_long,kj::PromiseFulfiller<kj::AsyncCapabilityStream::ReadResult>>(kj::PromiseFulfiller<kj::AsyncCapabilityStream::ReadResult>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedRead::tryPumpFrom(kj::AsyncInputStream&,unsigned_long)::_lambda(unsigned_long)_1_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionPromise<unsigned_long,kj::PromiseFulfiller<kj::AsyncCapabilityStream::ReadResult>>(kj::PromiseFulfiller<kj::AsyncCapabilityStream::ReadResult>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_,void*&>
                (location_00,&local_b8,&local_a8,&local_58,&local_88);
      local_b8.ptr[-4].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar2;
    }
    location.function = (char *)local_80.right;
    location.fileName = (char *)local_80.left;
    location._16_8_ = local_80.op.content.ptr;
    local_90.ptr = (PromiseNode *)location_00;
    kj::_::maybeChain<unsigned_long>(&local_40,(Promise<unsigned_long> *)&local_90,location);
    OVar3.ptr = local_40.ptr;
    local_40.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_40);
    local_b0.ptr = OVar3.ptr;
    local_38.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_38);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_90);
    newAdaptedPromise<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>,kj::Canceler&,kj::Promise<unsigned_long>>
              ((kj *)&local_48,(Canceler *)adapterConstructorParams,
               (Promise<unsigned_long> *)&local_b0);
    *(undefined1 *)
     &(this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
      _vptr_AsyncInputStream = 1;
    (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
    _vptr_AsyncOutputStream = local_48._vptr_AsyncOutputStream;
    local_48._vptr_AsyncOutputStream = (_func_int **)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_48);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_b0);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_b8);
    MVar7.ptr.field_1 = extraout_RDX;
    MVar7.ptr._0_8_ = this;
    return (Maybe<kj::Promise<unsigned_long>_>)MVar7.ptr;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&>
            ((Fault *)&local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0x447,FAILED,"minBytes > readSoFar.byteCount","_kjCondition,",&local_80);
  kj::_::Debug::Fault::fatal((Fault *)&local_a8);
}

Assistant:

TwoWayPipe newTwoWayPipe() {
  auto pipe1 = kj::refcounted<AsyncPipe>();
  auto pipe2 = kj::refcounted<AsyncPipe>();
  auto end1 = kj::heap<TwoWayPipeEnd>(kj::addRef(*pipe1), kj::addRef(*pipe2));
  auto end2 = kj::heap<TwoWayPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));
  return { { kj::mv(end1), kj::mv(end2) } };
}